

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_file_open_append(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  
  fs_file_open_append(0);
  fs_file_open_append(0);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xafc,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_file_open_append) {
  fs_file_open_append(0);
  fs_file_open_append(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}